

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

string_t __thiscall
duckdb::StringVector::AddStringOrBlob(StringVector *this,Vector *vector,string_t data)

{
  VectorStringBuffer *pVVar1;
  char *data_00;
  string_t sVar3;
  undefined8 local_20;
  char *local_18;
  char *pcVar2;
  
  pcVar2 = data.value._0_8_;
  if (0xc < (uint)vector) {
    pVVar1 = GetStringBuffer((Vector *)this);
    data_00 = pcVar2;
    if (((ulong)vector & 0xffffffff) < 0xd) {
      data_00 = (char *)((long)&local_20 + 4);
    }
    local_20 = vector;
    local_18 = pcVar2;
    sVar3 = StringHeap::AddBlob(&pVVar1->heap,data_00,(ulong)vector & 0xffffffff);
    pcVar2 = sVar3.value._8_8_;
    vector = sVar3.value._0_8_;
  }
  sVar3.value.pointer.ptr = pcVar2;
  sVar3.value._0_8_ = vector;
  return (string_t)sVar3.value;
}

Assistant:

string_t StringVector::AddStringOrBlob(Vector &vector, string_t data) {
	D_ASSERT(vector.GetType().InternalType() == PhysicalType::VARCHAR);
	if (data.IsInlined()) {
		// string will be inlined: no need to store in string heap
		return data;
	}
	auto &string_buffer = GetStringBuffer(vector);
	return string_buffer.AddBlob(data);
}